

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBody.cpp
# Opt level: O0

void __thiscall OpenMD::RigidBody::updateAtomVel(RigidBody *this,int frame)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  SquareMatrix3<double> *m1;
  SquareMatrix3<double> *m2;
  Vector<double,_3U> *v;
  StuntDouble *this_00;
  Vector<double,_3U> *v1;
  Vector<double,_3U> *pVVar4;
  reference ppAVar5;
  long *in_RDI;
  RectMatrix<double,_3U,_3U> *m;
  StuntDouble *this_01;
  uint i;
  Vector3d velRot;
  Vector3d rbVel;
  Mat3x3d mat;
  Mat3x3d I;
  Vector3d ji;
  Mat3x3d skewMat;
  Vector<double,_3U> *in_stack_fffffffffffffcb8;
  value_type v2;
  undefined8 in_stack_fffffffffffffcd0;
  int snapshotNo;
  StuntDouble *in_stack_fffffffffffffcd8;
  uint local_1d4;
  RectMatrix<double,_3U,_3U> local_c8;
  Vector<double,_3U> local_70;
  RectMatrix<double,_3U,_3U> local_58;
  
  snapshotNo = (int)((ulong)in_stack_fffffffffffffcd0 >> 0x20);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x27e8a3);
  StuntDouble::getJ(in_stack_fffffffffffffcd8,snapshotNo);
  (**(code **)(*in_RDI + 0x28))(&local_c8);
  pdVar3 = RectMatrix<double,_3U,_3U>::operator()(&local_58,0,0);
  *pdVar3 = 0.0;
  pdVar3 = Vector<double,_3U>::operator[](&local_70,2);
  dVar1 = *pdVar3;
  pdVar3 = RectMatrix<double,_3U,_3U>::operator()(&local_c8,2,2);
  dVar2 = *pdVar3;
  pdVar3 = RectMatrix<double,_3U,_3U>::operator()(&local_58,0,1);
  *pdVar3 = dVar1 / dVar2;
  pdVar3 = Vector<double,_3U>::operator[](&local_70,1);
  dVar1 = *pdVar3;
  pdVar3 = RectMatrix<double,_3U,_3U>::operator()(&local_c8,1,1);
  dVar2 = *pdVar3;
  pdVar3 = RectMatrix<double,_3U,_3U>::operator()(&local_58,0,2);
  *pdVar3 = -dVar1 / dVar2;
  pdVar3 = Vector<double,_3U>::operator[](&local_70,2);
  dVar1 = *pdVar3;
  pdVar3 = RectMatrix<double,_3U,_3U>::operator()(&local_c8,2,2);
  dVar2 = *pdVar3;
  pdVar3 = RectMatrix<double,_3U,_3U>::operator()(&local_58,1,0);
  *pdVar3 = -dVar1 / dVar2;
  pdVar3 = RectMatrix<double,_3U,_3U>::operator()(&local_58,1,1);
  *pdVar3 = 0.0;
  pdVar3 = Vector<double,_3U>::operator[](&local_70,0);
  dVar1 = *pdVar3;
  pdVar3 = RectMatrix<double,_3U,_3U>::operator()(&local_c8,0,0);
  dVar2 = *pdVar3;
  pdVar3 = RectMatrix<double,_3U,_3U>::operator()(&local_58,1,2);
  *pdVar3 = dVar1 / dVar2;
  pdVar3 = Vector<double,_3U>::operator[](&local_70,1);
  dVar1 = *pdVar3;
  pdVar3 = RectMatrix<double,_3U,_3U>::operator()(&local_c8,1,1);
  dVar2 = *pdVar3;
  pdVar3 = RectMatrix<double,_3U,_3U>::operator()(&local_58,2,0);
  *pdVar3 = dVar1 / dVar2;
  m1 = (SquareMatrix3<double> *)Vector<double,_3U>::operator[](&local_70,0);
  m = (RectMatrix<double,_3U,_3U> *)
      ((ulong)(m1->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][0] ^
      0x8000000000000000);
  m2 = (SquareMatrix3<double> *)RectMatrix<double,_3U,_3U>::operator()(&local_c8,0,0);
  this_01 = (StuntDouble *)
            ((double)m /
            (m2->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][0]);
  v = (Vector<double,_3U> *)RectMatrix<double,_3U,_3U>::operator()(&local_58,2,1);
  v->data_[0] = (double)this_01;
  this_00 = (StuntDouble *)RectMatrix<double,_3U,_3U>::operator()(&local_58,2,2);
  this_00->_vptr_StuntDouble = (_func_int **)0x0;
  StuntDouble::getA(this_01,(int)((ulong)this_00 >> 0x20));
  OpenMD::operator*(m1,m2);
  SquareMatrix3<double>::transpose((SquareMatrix3<double> *)m);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x27ed66);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x27ed73);
  StuntDouble::getVel(this_01,(int)((ulong)this_00 >> 0x20));
  Vector3<double>::Vector3((Vector3<double> *)0x27ed9e);
  local_1d4 = 0;
  while( true ) {
    v1 = (Vector<double,_3U> *)(ulong)local_1d4;
    pVVar4 = (Vector<double,_3U> *)
             std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::size
                       ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                         *)(in_RDI + 0x2b));
    if (pVVar4 <= v1) break;
    ppAVar5 = std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
                        ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI + 0x25),
                         (ulong)local_1d4);
    v2 = *ppAVar5;
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               (in_RDI + 0x2b),(ulong)local_1d4);
    OpenMD::operator*(m,v);
    OpenMD::operator+(v1,(Vector<double,_3U> *)v2);
    Vector3<double>::Vector3((Vector3<double> *)v2,in_stack_fffffffffffffcb8);
    StuntDouble::setVel(this_00,(Vector3d *)v1,(int)((ulong)v2 >> 0x20));
    local_1d4 = local_1d4 + 1;
  }
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x27ef49);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x27ef56);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x27ef63);
  return;
}

Assistant:

void RigidBody::updateAtomVel(int frame) {
    Mat3x3d skewMat;
    ;

    Vector3d ji = getJ(frame);
    Mat3x3d I   = getI();

    skewMat(0, 0) = 0;
    skewMat(0, 1) = ji[2] / I(2, 2);
    skewMat(0, 2) = -ji[1] / I(1, 1);

    skewMat(1, 0) = -ji[2] / I(2, 2);
    skewMat(1, 1) = 0;
    skewMat(1, 2) = ji[0] / I(0, 0);

    skewMat(2, 0) = ji[1] / I(1, 1);
    skewMat(2, 1) = -ji[0] / I(0, 0);
    skewMat(2, 2) = 0;

    Mat3x3d mat    = (getA(frame) * skewMat).transpose();
    Vector3d rbVel = getVel(frame);

    Vector3d velRot;
    for (unsigned int i = 0; i < refCoords_.size(); ++i) {
      atoms_[i]->setVel(rbVel + mat * refCoords_[i], frame);
    }
  }